

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  stbi__context *s;
  byte bVar1;
  uint uVar2;
  stbi__uint32 sVar3;
  int iVar4;
  uint uVar5;
  stbi_uc *psVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  void *pvVar10;
  char *pcVar11;
  stbi_uc **ppsVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int *piVar18;
  int iVar19;
  long *in_FS_OFFSET;
  
  s = z->s;
  uVar2 = stbi__get16be(s);
  if (uVar2 < 0xb) {
LAB_00162a30:
    lVar13 = *in_FS_OFFSET;
    pcVar11 = "bad SOF len";
  }
  else {
    psVar6 = s->img_buffer;
    if (psVar6 < s->img_buffer_end) {
LAB_00162a70:
      s->img_buffer = psVar6 + 1;
      if (*psVar6 == '\b') {
        sVar3 = stbi__get16be(s);
        s->img_y = sVar3;
        if (sVar3 == 0) {
          lVar13 = *in_FS_OFFSET;
          pcVar11 = "no header height";
          goto LAB_00162cdf;
        }
        sVar3 = stbi__get16be(s);
        s->img_x = sVar3;
        if (sVar3 == 0) {
          lVar13 = *in_FS_OFFSET;
          pcVar11 = "0 width";
          goto LAB_00162cdf;
        }
        if (0x1000000 < s->img_y) {
          lVar13 = *in_FS_OFFSET;
          pcVar11 = "too large";
          goto LAB_00162cdf;
        }
        pbVar8 = s->img_buffer;
        if (pbVar8 < s->img_buffer_end) {
LAB_00162b33:
          s->img_buffer = pbVar8 + 1;
          bVar1 = *pbVar8;
          if ((bVar1 < 5) && ((0x1aU >> (bVar1 & 0x1f) & 1) != 0)) {
            s->img_n = (uint)bVar1;
            uVar7 = (ulong)(uint)bVar1;
            ppsVar12 = &z->img_comp[0].data;
            do {
              *ppsVar12 = (stbi_uc *)0x0;
              ppsVar12[3] = (stbi_uc *)0x0;
              ppsVar12 = ppsVar12 + 0xc;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            if (uVar2 == s->img_n * 3 + 8U) {
              z->rgb = 0;
              uVar7 = (ulong)(uint)s->img_n;
              if (0 < s->img_n) {
                piVar18 = &z->img_comp[0].tq;
                lVar13 = 0;
                do {
                  pbVar8 = s->img_buffer;
                  if (pbVar8 < s->img_buffer_end) {
LAB_00162bd3:
                    s->img_buffer = pbVar8 + 1;
                    bVar1 = *pbVar8;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar8 = s->img_buffer;
                      goto LAB_00162bd3;
                    }
                    bVar1 = 0;
                  }
                  ((anon_struct_96_18_0d0905d3 *)(piVar18 + -3))->id = (uint)bVar1;
                  if ((s->img_n == 3) && (bVar1 == "RGB"[lVar13])) {
                    z->rgb = z->rgb + 1;
                  }
                  pbVar8 = s->img_buffer;
                  if (s->img_buffer_end <= pbVar8) {
                    if (s->read_from_callbacks == 0) {
                      piVar18[-2] = 0;
                      goto LAB_00162f5c;
                    }
                    stbi__refill_buffer(s);
                    pbVar8 = s->img_buffer;
                  }
                  s->img_buffer = pbVar8 + 1;
                  bVar1 = *pbVar8;
                  piVar18[-2] = (uint)(bVar1 >> 4);
                  if ((byte)(bVar1 + 0xb0) < 0xc0) goto LAB_00162f5c;
                  piVar18[-1] = bVar1 & 0xf;
                  if ((bVar1 & 0xf) - 5 < 0xfffffffc) goto LAB_00162f23;
                  pbVar8 = s->img_buffer;
                  if (pbVar8 < s->img_buffer_end) {
LAB_00162c8a:
                    s->img_buffer = pbVar8 + 1;
                    bVar1 = *pbVar8;
                    *piVar18 = (uint)bVar1;
                    if (3 < bVar1) {
                      lVar13 = *in_FS_OFFSET;
                      pcVar11 = "bad TQ";
                      goto LAB_00162cdf;
                    }
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar8 = s->img_buffer;
                      goto LAB_00162c8a;
                    }
                    *piVar18 = 0;
                  }
                  lVar13 = lVar13 + 1;
                  uVar7 = (ulong)s->img_n;
                  piVar18 = piVar18 + 0x18;
                } while (lVar13 < (long)uVar7);
              }
              if (scan != 0) {
                return 1;
              }
              iVar15 = (int)uVar7;
              iVar4 = stbi__mad3sizes_valid(s->img_x,s->img_y,iVar15,0);
              if (iVar4 == 0) {
                *(char **)(*in_FS_OFFSET + -0x20) = "too large";
                return 0;
              }
              uVar14 = 1;
              uVar16 = 1;
              if (0 < iVar15) {
                lVar13 = (uVar7 & 0xffffffff) * 0x60;
                uVar14 = 1;
                lVar9 = 0;
                uVar16 = 1;
                do {
                  uVar2 = *(uint *)((long)&z->img_comp[0].h + lVar9);
                  uVar5 = *(uint *)((long)&z->img_comp[0].v + lVar9);
                  if ((int)uVar16 < (int)uVar2) {
                    uVar16 = (ulong)uVar2;
                  }
                  if ((int)uVar14 < (int)uVar5) {
                    uVar14 = (ulong)uVar5;
                  }
                  lVar9 = lVar9 + 0x60;
                } while (lVar13 != lVar9);
                if (0 < iVar15) {
                  lVar9 = 0;
                  do {
                    if ((int)uVar16 % *(int *)((long)&z->img_comp[0].h + lVar9) != 0)
                    goto LAB_00162f5c;
                    if ((int)uVar14 % *(int *)((long)&z->img_comp[0].v + lVar9) != 0)
                    goto LAB_00162f23;
                    lVar9 = lVar9 + 0x60;
                  } while (lVar13 != lVar9);
                }
              }
              iVar15 = (int)uVar16;
              z->img_h_max = iVar15;
              iVar4 = (int)uVar14;
              z->img_v_max = iVar4;
              z->img_mcu_w = iVar15 * 8;
              z->img_mcu_h = iVar4 * 8;
              uVar2 = ((s->img_x + iVar15 * 8) - 1) / (uint)(iVar15 * 8);
              z->img_mcu_x = uVar2;
              uVar5 = ((s->img_y + iVar4 * 8) - 1) / (uint)(iVar4 * 8);
              z->img_mcu_y = uVar5;
              if (s->img_n < 1) {
                return 1;
              }
              piVar18 = &z->img_comp[0].coeff_h;
              lVar13 = 0;
              while( true ) {
                piVar18[-0x10] = (int)((s->img_x * piVar18[-0x16] + iVar15 + -1) / uVar16);
                piVar18[-0xf] = (int)((s->img_y * piVar18[-0x15] + iVar4 + -1) / uVar14);
                iVar19 = piVar18[-0x16] * uVar2;
                a = iVar19 * 8;
                piVar18[-0xe] = a;
                iVar17 = piVar18[-0x15] * uVar5;
                b = iVar17 * 8;
                piVar18[-0xd] = b;
                pvVar10 = stbi__malloc_mad2(a,b,0xf);
                *(void **)(piVar18 + -7) = (void *)0x0;
                *(stbi_uc **)(piVar18 + -5) = (stbi_uc *)0x0;
                *(short **)(piVar18 + -3) = (short *)0x0;
                *(void **)(piVar18 + -9) = pvVar10;
                why = extraout_EDX;
                if (pvVar10 == (void *)0x0) break;
                *(stbi_uc **)(piVar18 + -0xb) =
                     (stbi_uc *)((long)pvVar10 + 0xfU & 0xfffffffffffffff0);
                if (z->progressive != 0) {
                  piVar18[-1] = iVar19;
                  *piVar18 = iVar17;
                  pvVar10 = stbi__malloc_mad3(a,b,2,0xf);
                  *(void **)(piVar18 + -7) = pvVar10;
                  why = extraout_EDX_00;
                  if (pvVar10 == (void *)0x0) break;
                  *(short **)(piVar18 + -3) = (short *)((long)pvVar10 + 0xfU & 0xfffffffffffffff0);
                }
                lVar13 = lVar13 + 1;
                piVar18 = piVar18 + 0x18;
                if (s->img_n <= lVar13) {
                  return 1;
                }
              }
              *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
              stbi__free_jpeg_components(z,(int)lVar13 + 1,why);
              return 0;
            }
            goto LAB_00162a30;
          }
        }
        else if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar8 = s->img_buffer;
          goto LAB_00162b33;
        }
        lVar13 = *in_FS_OFFSET;
        pcVar11 = "bad component count";
        goto LAB_00162cdf;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar6 = s->img_buffer;
      goto LAB_00162a70;
    }
    lVar13 = *in_FS_OFFSET;
    pcVar11 = "only 8-bit";
  }
  goto LAB_00162cdf;
LAB_00162f5c:
  lVar13 = *in_FS_OFFSET;
  pcVar11 = "bad H";
  goto LAB_00162cdf;
LAB_00162f23:
  lVar13 = *in_FS_OFFSET;
  pcVar11 = "bad V";
LAB_00162cdf:
  *(char **)(lVar13 + -0x20) = pcVar11;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}